

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void test_smoothsort(uint N_lists,uint list_max)

{
  bool bVar1;
  int iVar2;
  time_t tVar3;
  ostream *poVar4;
  ulong uVar5;
  int *data;
  void *pvVar6;
  int *piVar7;
  iterator local_68;
  iterator local_60;
  iterator it;
  bool not_sorted;
  undefined1 local_40 [4];
  int last;
  sorted_ptr_arr<int> sorted_data;
  uint i;
  int *input_copy;
  int *test_input;
  uint N;
  uint k;
  uint list_max_local;
  uint N_lists_local;
  
  tVar3 = time((time_t *)0x0);
  srand((uint)tVar3);
  poVar4 = std::operator<<((ostream *)&std::cout,"Sorting ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,N_lists);
  poVar4 = std::operator<<(poVar4," lists of at most ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,list_max);
  std::operator<<(poVar4," elements each...");
  for (test_input._4_4_ = 0; test_input._4_4_ < N_lists; test_input._4_4_ = test_input._4_4_ + 1) {
    uVar5 = SUB168(ZEXT416(list_max) * ZEXT816(4),0);
    if (SUB168(ZEXT416(list_max) * ZEXT816(4),8) != 0) {
      uVar5 = 0xffffffffffffffff;
    }
    data = (int *)operator_new__(uVar5);
    uVar5 = SUB168(ZEXT416(list_max) * ZEXT816(4),0);
    if (SUB168(ZEXT416(list_max) * ZEXT816(4),8) != 0) {
      uVar5 = 0xffffffffffffffff;
    }
    pvVar6 = operator_new__(uVar5);
    for (sorted_data.N._4_4_ = 0; sorted_data.N._4_4_ < list_max;
        sorted_data.N._4_4_ = sorted_data.N._4_4_ + 1) {
      iVar2 = rand();
      data[sorted_data.N._4_4_] = (int)(((double)iVar2 * 100.0) / 2147483647.0);
      *(int *)((long)pvVar6 + (ulong)sorted_data.N._4_4_ * 4) = data[sorted_data.N._4_4_];
    }
    sorted_ptr_arr<int>::sorted_ptr_arr((sorted_ptr_arr<int> *)local_40,data,(ulong)list_max);
    piVar7 = sorted_ptr_arr<int>::operator[]((sorted_ptr_arr<int> *)local_40,0);
    iVar2 = *piVar7;
    it.curr_ptr._3_1_ = 0;
    local_60 = sorted_ptr_arr<int>::begin((sorted_ptr_arr<int> *)local_40);
    while( true ) {
      local_68 = sorted_ptr_arr<int>::end((sorted_ptr_arr<int> *)local_40);
      bVar1 = sorted_ptr_arr<int>::iterator::operator!=(&local_60,&local_68);
      if (!bVar1) break;
      piVar7 = sorted_ptr_arr<int>::iterator::operator*(&local_60);
      if (*piVar7 < iVar2) {
        it.curr_ptr._3_1_ = 1;
      }
      sorted_ptr_arr<int>::iterator::operator++(&local_60);
    }
    if ((it.curr_ptr._3_1_ & 1) != 0) {
      poVar4 = std::operator<<((ostream *)&std::cout,"# NOT SORTED");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    }
    if (data != (int *)0x0) {
      operator_delete__(data);
    }
    if (pvVar6 != (void *)0x0) {
      operator_delete__(pvVar6);
    }
    sorted_ptr_arr<int>::~sorted_ptr_arr((sorted_ptr_arr<int> *)local_40);
  }
  poVar4 = std::operator<<((ostream *)&std::cout,"Done.");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void test_smoothsort(unsigned int N_lists, unsigned int list_max) {
	srand(time(NULL));
	
	std::cout << "Sorting " << N_lists << " lists of at most " << list_max << " elements each..."; 
	for(unsigned int k=0; k<N_lists; k++) {
		unsigned int N = list_max;//= (int)((double)list_max*(double)rand()/(double)RAND_MAX)+1;
		int* test_input = new int[N];
		int* input_copy = new int[N];
		for(unsigned int i=0; i<N; i++) { test_input[i] = (int)(100*(double)rand()/(double)RAND_MAX); input_copy[i] = test_input[i]; }
		
		//std::cout << std::endl;
		//for(unsigned int i=0; i<N; i++) { std::cout << test_input[i] << "\t"; }
		//std::cout << std::endl << std::endl;
		
		sorted_ptr_arr<int> sorted_data(&test_input[0], N);
		int last = sorted_data[0];
		bool not_sorted = false;
		for(sorted_ptr_arr<int>::iterator it=sorted_data.begin(); it != sorted_data.end(); ++it) {
			if(last > *it) { not_sorted = true; }
			//std::cout << *it << "\t";
		}
		//std::cout << std::endl;
		if(not_sorted) { std::cout << "# NOT SORTED" << std::endl; }
		//std::cout << std::endl;
		
		
		delete[] test_input;
		delete[] input_copy;
	}
	std::cout << "Done." << std::endl;
}